

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O2

uint __thiscall
crnlib::symbol_codec::encode_transmit_static_huffman_data_model
          (symbol_codec *this,static_huffman_data_model *model,bool simulate,
          static_huffman_data_model *pDeltaModel)

{
  ushort uVar1;
  symbol_codec *this_00;
  int iVar2;
  uint uVar3;
  uint num_bits;
  uchar *puVar4;
  ulong uVar5;
  uint uVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  uint i_2;
  uint uVar8;
  uint uVar9;
  byte bVar10;
  uint i;
  uint uVar11;
  ulong uVar12;
  byte *pbVar13;
  uint cur_nonzero_run_size;
  undefined4 local_e8;
  uint cur_zero_run_size;
  symbol_codec *local_e0;
  vector<unsigned_short> codes;
  vector<unsigned_char> delta_code_sizes;
  static_huffman_data_model dm;
  uint16 hist [21];
  
  local_e8 = (undefined4)CONCAT71(in_register_00000011,simulate);
  uVar8 = model->m_total_syms;
  puVar4 = (model->m_code_sizes).m_p + uVar8;
  uVar12 = 0;
  do {
    puVar4 = puVar4 + -1;
    if (uVar8 == uVar12) {
      if (!simulate) {
        uVar9 = math::total_bits(0x2000);
        encode_bits(this,0,uVar9);
      }
      uVar9 = math::total_bits(0x2000);
      return uVar9;
    }
    uVar12 = uVar12 + 1;
  } while (*puVar4 == '\0');
  codes.m_p = (unsigned_short *)0x0;
  codes.m_size = 0;
  codes.m_capacity = 0;
  local_e0 = this;
  vector<unsigned_short>::reserve(&codes,uVar8);
  uVar9 = (uVar8 + 1) - (int)uVar12;
  cur_zero_run_size = 0;
  cur_nonzero_run_size = 0;
  uVar12 = (uVar8 + 1) - uVar12;
  pbVar13 = (model->m_code_sizes).m_p;
  delta_code_sizes.m_p = (uchar *)0x0;
  delta_code_sizes.m_size = 0;
  delta_code_sizes.m_capacity = 0;
  uVar8 = (uint)uVar12;
  if ((pDeltaModel != (static_huffman_data_model *)0x0) && (pDeltaModel->m_total_syms != 0)) {
    uVar3 = 0;
    if ((pDeltaModel->m_code_sizes).m_size < uVar8) goto LAB_00181d1d;
    vector<unsigned_char>::resize(&delta_code_sizes,uVar9,false);
    for (uVar5 = 0; pbVar13 = delta_code_sizes.m_p, (uVar12 & 0xffffffff) != uVar5;
        uVar5 = uVar5 + 1) {
      uVar6 = (uint)(model->m_code_sizes).m_p[uVar5] - (uint)(pDeltaModel->m_code_sizes).m_p[uVar5];
      uVar11 = uVar6 + 0x11 & 0xff;
      if (-1 < (int)uVar6) {
        uVar11 = uVar6;
      }
      delta_code_sizes.m_p[uVar5] = (uchar)uVar11;
    }
  }
  uVar3 = 0xffffffff;
  for (uVar11 = 0; uVar11 <= uVar9; uVar11 = uVar11 + 1) {
    uVar6 = 0xff;
    if (uVar11 < uVar8) {
      bVar10 = *pbVar13;
      uVar6 = (uint)bVar10;
      pbVar13 = pbVar13 + 1;
      if (bVar10 != 0) goto LAB_00181b19;
      end_nonzero_run(&cur_nonzero_run_size,uVar3,&codes);
      cur_zero_run_size = cur_zero_run_size + 1;
      uVar3 = 0;
      if (cur_zero_run_size == 0x8a) {
        end_zero_run(&cur_zero_run_size,&codes);
        uVar3 = 0;
      }
    }
    else {
LAB_00181b19:
      end_zero_run(&cur_zero_run_size,&codes);
      if (uVar6 == uVar3) {
        cur_nonzero_run_size = cur_nonzero_run_size + 1;
        if (cur_nonzero_run_size == 0x46) {
          end_nonzero_run(&cur_nonzero_run_size,uVar3,&codes);
        }
      }
      else {
        end_nonzero_run(&cur_nonzero_run_size,uVar3,&codes);
        uVar3 = 0xff;
        if (uVar6 != 0xff) {
          dm.m_total_syms._0_2_ = (undefined2)uVar6;
          vector<unsigned_short>::push_back(&codes,(unsigned_short *)&dm);
          uVar3 = uVar6;
        }
      }
    }
  }
  hist[0x10] = 0;
  hist[0x11] = 0;
  hist[0x12] = 0;
  hist[0x13] = 0;
  hist[0x14] = 0;
  hist[8] = 0;
  hist[9] = 0;
  hist[10] = 0;
  hist[0xb] = 0;
  hist[0xc] = 0;
  hist[0xd] = 0;
  hist[0xe] = 0;
  hist[0xf] = 0;
  hist[0] = 0;
  hist[1] = 0;
  hist[2] = 0;
  hist[3] = 0;
  hist[4] = 0;
  hist[5] = 0;
  hist[6] = 0;
  hist[7] = 0;
  for (uVar12 = 0; (codes._8_8_ & 0xffffffff) != uVar12; uVar12 = uVar12 + 1) {
    hist[(byte)codes.m_p[uVar12]] = hist[(byte)codes.m_p[uVar12]] + 1;
  }
  static_huffman_data_model::static_huffman_data_model(&dm);
  iVar2 = static_huffman_data_model::init(&dm,(EVP_PKEY_CTX *)0x1);
  uVar3 = 0;
  if ((char)iVar2 != '\0') {
    uVar12 = 0x16;
    uVar5 = 0x14;
    do {
      if (uVar5 == 0xffffffffffffffff) {
        uVar12 = 0;
        break;
      }
      uVar7 = uVar5 & 0xffffffff;
      uVar12 = (ulong)((int)uVar12 - 1);
      uVar5 = uVar5 - 1;
    } while (dm.m_code_sizes.m_p[(byte)(&g_most_probable_codelength_codes)[uVar7]] == '\0');
    uVar3 = math::total_bits(0x2000);
    if ((char)local_e8 == '\0') {
      num_bits = math::total_bits(0x2000);
      this_00 = local_e0;
      encode_bits(local_e0,uVar9,num_bits);
      record_put_bits(this_00,(uint)uVar12,5);
      for (uVar5 = 0; uVar12 != uVar5; uVar5 = uVar5 + 1) {
        record_put_bits(local_e0,(uint)dm.m_code_sizes.m_p
                                       [(byte)(&g_most_probable_codelength_codes)[uVar5]],3);
      }
    }
    uVar3 = uVar3 + (uint)uVar12 * 3 + 5;
    for (uVar12 = 0; uVar12 < (codes._8_8_ & 0xffffffff); uVar12 = uVar12 + 1) {
      uVar1 = codes.m_p[uVar12];
      uVar5 = (ulong)uVar1 & 0xff;
      bVar10 = (char)uVar1 - 0x11;
      if (bVar10 < 4) {
        uVar9 = *(uint *)(&DAT_001992a0 + (ulong)bVar10 * 4);
        uVar3 = uVar3 + dm.m_code_sizes.m_p[uVar5];
        if ((char)local_e8 == '\0') goto LAB_00181ce2;
LAB_00181d08:
        uVar3 = uVar3 + uVar9;
      }
      else {
        uVar3 = uVar3 + dm.m_code_sizes.m_p[uVar5];
        uVar9 = 0;
        if ((char)local_e8 == '\0') {
LAB_00181ce2:
          encode(local_e0,(uint)uVar5,&dm);
          if (bVar10 < 4) {
            encode_bits(local_e0,(uint)(uVar1 >> 8),uVar9);
            goto LAB_00181d08;
          }
        }
      }
    }
  }
  static_huffman_data_model::~static_huffman_data_model(&dm);
LAB_00181d1d:
  vector<unsigned_char>::~vector(&delta_code_sizes);
  vector<unsigned_short>::~vector(&codes);
  return uVar3;
}

Assistant:

uint symbol_codec::encode_transmit_static_huffman_data_model(static_huffman_data_model& model, bool simulate = false, static_huffman_data_model* pDeltaModel) {
  CRNLIB_ASSERT(m_mode == cEncoding);

  uint total_used_syms = 0;
  for (uint i = model.m_total_syms; i > 0; i--) {
    if (model.m_code_sizes[i - 1]) {
      total_used_syms = i;
      break;
    }
  }

  if (!total_used_syms) {
    if (!simulate) {
      encode_bits(0, math::total_bits(prefix_coding::cMaxSupportedSyms));
    }

    return math::total_bits(prefix_coding::cMaxSupportedSyms);
  }

  crnlib::vector<uint16> codes;
  codes.reserve(model.m_total_syms);

  uint prev_len = UINT_MAX;
  uint cur_zero_run_size = 0;
  uint cur_nonzero_run_size = 0;

  const uint8* pCodesizes = &model.m_code_sizes[0];

  crnlib::vector<uint8> delta_code_sizes;
  if ((pDeltaModel) && (pDeltaModel->get_total_syms())) {
    if (pDeltaModel->m_code_sizes.size() < total_used_syms)
      return 0;

    delta_code_sizes.resize(total_used_syms);
    for (uint i = 0; i < total_used_syms; i++) {
      int delta = (int)model.m_code_sizes[i] - (int)pDeltaModel->m_code_sizes[i];
      if (delta < 0)
        delta += 17;
      delta_code_sizes[i] = static_cast<uint8>(delta);
    }

    pCodesizes = delta_code_sizes.get_ptr();
  }

  for (uint i = 0; i <= total_used_syms; i++) {
    const uint len = (i < total_used_syms) ? *pCodesizes++ : 0xFF;
    CRNLIB_ASSERT((len == 0xFF) || (len <= prefix_coding::cMaxExpectedCodeSize));

    if (!len) {
      end_nonzero_run(cur_nonzero_run_size, prev_len, codes);

      if (++cur_zero_run_size == cMaxLargeZeroRunSize)
        end_zero_run(cur_zero_run_size, codes);
    } else {
      end_zero_run(cur_zero_run_size, codes);

      if (len != prev_len) {
        end_nonzero_run(cur_nonzero_run_size, prev_len, codes);

        if (len != 0xFF)
          codes.push_back(static_cast<uint16>(len));
      } else if (++cur_nonzero_run_size == cLargeMaxNonZeroRunSize)
        end_nonzero_run(cur_nonzero_run_size, prev_len, codes);
    }

    prev_len = len;
  }

  uint16 hist[cMaxCodelengthCodes];
  utils::zero_object(hist);

  for (uint i = 0; i < codes.size(); i++) {
    uint code = codes[i] & 0xFF;
    CRNLIB_ASSERT(code < cMaxCodelengthCodes);
    hist[code] = static_cast<uint16>(hist[code] + 1);
  }

  static_huffman_data_model dm;
  if (!dm.init(true, cMaxCodelengthCodes, hist, 7))
    return 0;

  uint num_codelength_codes_to_send;
  for (num_codelength_codes_to_send = cNumMostProbableCodelengthCodes; num_codelength_codes_to_send > 0; num_codelength_codes_to_send--)
    if (dm.get_cost(g_most_probable_codelength_codes[num_codelength_codes_to_send - 1]))
      break;

  uint total_bits = math::total_bits(prefix_coding::cMaxSupportedSyms);
  total_bits += 5;
  total_bits += 3 * num_codelength_codes_to_send;

  if (!simulate) {
    encode_bits(total_used_syms, math::total_bits(prefix_coding::cMaxSupportedSyms));

    encode_bits(num_codelength_codes_to_send, 5);
    for (uint i = 0; i < num_codelength_codes_to_send; i++)
      encode_bits(dm.get_cost(g_most_probable_codelength_codes[i]), 3);
  }

  for (uint i = 0; i < codes.size(); i++) {
    uint code = codes[i];
    uint extra = code >> 8;
    code &= 0xFF;

    uint extra_bits = 0;
    if (code == cSmallZeroRunCode)
      extra_bits = cSmallZeroRunExtraBits;
    else if (code == cLargeZeroRunCode)
      extra_bits = cLargeZeroRunExtraBits;
    else if (code == cSmallRepeatCode)
      extra_bits = cSmallNonZeroRunExtraBits;
    else if (code == cLargeRepeatCode)
      extra_bits = cLargeNonZeroRunExtraBits;

    total_bits += dm.get_cost(code);

    if (!simulate)
      encode(code, dm);

    if (extra_bits) {
      if (!simulate)
        encode_bits(extra, extra_bits);

      total_bits += extra_bits;
    }
  }

  return total_bits;
}